

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O2

void Js::CrossSite::ForceCrossSiteThunkOnPrototypeChain(RecyclableObject *object)

{
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  DynamicObject *this;
  
  bVar1 = TaggedNumber::Is(object);
  if (!bVar1) {
    while (bVar1 = DynamicType::Is(((object->type).ptr)->typeId), bVar1) {
      bVar1 = VarIsImpl<Js::JavascriptProxy>(object);
      if (bVar1) {
        return;
      }
      this = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
      iVar2 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x66])(this);
      if ((iVar2 == 0) &&
         (BVar3 = RecyclableObject::IsExternal(&this->super_RecyclableObject), BVar3 == 0)) {
        (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x61])(this,0);
      }
      object = RecyclableObject::GetPrototype(object);
    }
  }
  return;
}

Assistant:

void CrossSite::ForceCrossSiteThunkOnPrototypeChain(RecyclableObject* object)
    {
        if (TaggedNumber::Is(object))
        {
            return;
        }
        while (DynamicType::Is(object->GetTypeId()) && !VarIs<JavascriptProxy>(object))
        {
            DynamicObject* dynamicObject = UnsafeVarTo<DynamicObject>(object);
            if (!dynamicObject->IsCrossSiteObject() && !dynamicObject->IsExternal())
            {
                // force to install cross-site thunk on prototype objects.
                dynamicObject->MarshalToScriptContext(nullptr);
            }
            object = object->GetPrototype();
        }
        return;

    }